

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O0

void anon_unknown.dwarf_1677::ndiPHSRHelper(ndicapi *pol,char *command,char *commandReply)

{
  bool bVar1;
  int local_2c;
  char *pcStack_28;
  int j;
  char *writePointer;
  char *commandReply_local;
  char *command_local;
  ndicapi *pol_local;
  
  local_2c = 0;
  pcStack_28 = pol->PhsrReply;
  writePointer = commandReply;
  while( true ) {
    bVar1 = false;
    if (local_2c < 0x502) {
      bVar1 = '\x1f' < *writePointer;
    }
    if (!bVar1) break;
    *pcStack_28 = *writePointer;
    local_2c = local_2c + 1;
    pcStack_28 = pcStack_28 + 1;
    writePointer = writePointer + 1;
  }
  *pcStack_28 = '\0';
  return;
}

Assistant:

void ndiPHSRHelper(ndicapi* pol, const char* command, const char* commandReply)
  {
    char* writePointer;
    int j;

    writePointer = pol->PhsrReply;
    for (j = 0; j < 1282 && *commandReply >= ' '; j++)
    {
      *writePointer++ = *commandReply++;
    }
    *writePointer++ = '\0';
  }